

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_type_lookupSelector(sysbvm_context_t *context,sysbvm_tuple_t type,sysbvm_tuple_t selector)

{
  _Bool _Var1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t selector_00;
  sysbvm_globalLookupCacheEntry_t *psVar6;
  
  if (((type & 0xf) == 0 && type != 0) && (_Var1 = sysbvm_tuple_isDummyValue(type), !_Var1)) {
    sVar3 = sysbvm_tuple_identityHash(type);
    sVar4 = sysbvm_tuple_identityHash(selector);
    uVar2 = (int)sVar4 + (int)sVar3 * 0x6d & 0xff;
    psVar6 = (context->roots).globalMethodLookupCache + uVar2;
    if ((psVar6->type == type) &&
       ((context->roots).globalMethodLookupCache[uVar2].selector == selector)) {
      return (context->roots).globalMethodLookupCache[uVar2].method;
    }
    sVar5 = sysbvm_type_lookupSelectorRecursively((sysbvm_context_t *)type,selector,selector_00);
    if (sVar5 != 0) {
      psVar6->type = type;
      (context->roots).globalMethodLookupCache[uVar2].selector = selector;
      (context->roots).globalMethodLookupCache[uVar2].method = sVar5;
      return sVar5;
    }
  }
  return 0;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_lookupSelector(sysbvm_context_t *context, sysbvm_tuple_t type, sysbvm_tuple_t selector)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return SYSBVM_NULL_TUPLE;
    if(sysbvm_tuple_isDummyValue(type)) return SYSBVM_NULL_TUPLE;

    // FIXME: Make this cache atomic and thread safe.
    size_t cacheEntryIndex = computeLookupCacheEntryIndexFor(type, selector);
    sysbvm_globalLookupCacheEntry_t *cacheEntry = context->roots.globalMethodLookupCache + cacheEntryIndex;
    if(cacheEntry->type != type || cacheEntry->selector != selector)
    {
        sysbvm_tuple_t method = sysbvm_type_lookupSelectorRecursively(context, type, selector);
        if(method)
        {
            cacheEntry->type = type;
            cacheEntry->selector = selector;
            cacheEntry->method = method;
        }
        return method;
    }
    else
    {
        return cacheEntry->method;
    }
}